

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotBarsEx<ImPlot::GetterXsYs<double>>
               (char *label_id,GetterXsYs<double> *getter,double width)

{
  ImPlotNextItemData *col;
  double dVar1;
  double dVar2;
  bool bVar3;
  ImPlotContext *pIVar4;
  bool bVar5;
  ImU32 col_00;
  ImU32 col_01;
  long lVar6;
  ImDrawList *this;
  int iVar7;
  int iVar8;
  double dVar9;
  ImVec2 a;
  ImVec2 b;
  ImPlotPoint local_48;
  ImVec2 local_38;
  
  bVar5 = BeginItem(label_id,1);
  if (bVar5) {
    dVar9 = width * 0.5;
    if ((GImPlot->FitThisFrame == true) && (iVar7 = getter->Count, 0 < iVar7)) {
      iVar8 = 0;
      do {
        lVar6 = (long)(((getter->Offset + iVar8) % iVar7 + iVar7) % iVar7) * (long)getter->Stride;
        dVar1 = *(double *)((long)getter->Xs + lVar6);
        local_48.y = *(double *)((long)getter->Ys + lVar6);
        local_48.x = dVar1 - dVar9;
        FitPoint(&local_48);
        local_48.x = dVar1 + dVar9;
        local_48.y = 0.0;
        FitPoint(&local_48);
        iVar8 = iVar8 + 1;
        iVar7 = getter->Count;
      } while (iVar8 < iVar7);
    }
    pIVar4 = GImPlot;
    col = &GImPlot->NextItemData;
    this = GetPlotDrawList();
    col_00 = ImGui::GetColorU32(col->Colors);
    col_01 = ImGui::GetColorU32((pIVar4->NextItemData).Colors + 1);
    iVar7 = getter->Count;
    if (0 < iVar7) {
      bVar5 = (pIVar4->NextItemData).RenderFill;
      bVar3 = (pIVar4->NextItemData).RenderLine;
      iVar8 = 0;
      do {
        lVar6 = (long)(((getter->Offset + iVar8) % iVar7 + iVar7) % iVar7) * (long)getter->Stride;
        dVar1 = *(double *)((long)getter->Ys + lVar6);
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          dVar2 = *(double *)((long)getter->Xs + lVar6);
          local_48.x = (double)PlotToPixels(dVar2 - dVar9,dVar1,-1);
          local_38 = PlotToPixels(dVar2 + dVar9,0.0,-1);
          if ((pIVar4->NextItemData).RenderFill == true) {
            ImDrawList::AddRectFilled(this,(ImVec2 *)&local_48,&local_38,col_01,0.0,0xf);
          }
          if (((bVar5 ^ 1U | col_00 != col_01) & bVar3) != 0) {
            ImDrawList::AddRect(this,(ImVec2 *)&local_48,&local_38,col_00,0.0,0xf,
                                (pIVar4->NextItemData).LineWeight);
          }
          iVar7 = getter->Count;
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 < iVar7);
    }
    pIVar4 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar4->NextItemData);
    pIVar4->PreviousItem = pIVar4->CurrentItem;
    pIVar4->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotBarsEx(const char* label_id, const Getter& getter, double width) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const double half_width = width / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(p.x - half_width, p.y));
                FitPoint(ImPlotPoint(p.x + half_width, 0));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.y == 0)
                continue;
            ImVec2 a = PlotToPixels(p.x - half_width, p.y);
            ImVec2 b = PlotToPixels(p.x + half_width, 0);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawCornerFlags_All, s.LineWeight);
        }
        EndItem();
    }
}